

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O3

int mbedtls_asn1_traverse_sequence_of
              (uchar **p,uchar *end,uchar tag_must_mask,uchar tag_must_val,uchar tag_may_mask,
              uchar tag_may_val,_func_int_void_ptr_int_uchar_ptr_size_t *cb,void *ctx)

{
  byte bVar1;
  uchar *puVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  undefined7 in_register_00000009;
  byte *pbVar6;
  undefined3 in_register_00000081;
  undefined3 in_register_00000089;
  size_t len;
  size_t local_48;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  puVar2 = *p;
  if (end == puVar2 || (long)end - (long)puVar2 < 0) {
    iVar4 = -0x60;
  }
  else if (*puVar2 == '0') {
    local_34 = (undefined4)CONCAT71(in_register_00000009,tag_must_val);
    *p = puVar2 + 1;
    iVar4 = mbedtls_asn1_get_len(p,end,&local_48);
    if (iVar4 == 0) {
      pbVar6 = *p;
      iVar4 = -0x66;
      if (pbVar6 + local_48 == end) {
        iVar4 = 0;
        local_38 = CONCAT31(in_register_00000081,tag_may_mask);
        local_3c = CONCAT31(in_register_00000089,tag_may_val);
        while (pbVar6 < end) {
          *p = pbVar6 + 1;
          bVar1 = *pbVar6;
          if ((bVar1 & tag_must_mask) != (byte)local_34) goto LAB_00134877;
          iVar5 = mbedtls_asn1_get_len(p,end,&local_48);
          sVar3 = local_48;
          if (iVar5 != 0) {
            return iVar5;
          }
          if (cb != (_func_int_void_ptr_int_uchar_ptr_size_t *)0x0) {
            if (((bVar1 & (byte)local_38) == (byte)local_3c) &&
               (iVar5 = (*cb)(ctx,(int)bVar1,*p,local_48), iVar5 != 0)) {
              return iVar5;
            }
          }
          pbVar6 = *p + sVar3;
          *p = pbVar6;
        }
      }
    }
  }
  else {
LAB_00134877:
    iVar4 = -0x62;
  }
  return iVar4;
}

Assistant:

int mbedtls_asn1_traverse_sequence_of(
    unsigned char **p,
    const unsigned char *end,
    unsigned char tag_must_mask, unsigned char tag_must_val,
    unsigned char tag_may_mask, unsigned char tag_may_val,
    int (*cb)( void *ctx, int tag,
               unsigned char *start, size_t len ),
    void *ctx )
{
    int ret;
    size_t len;

    /* Get main sequence tag */
    if( ( ret = mbedtls_asn1_get_tag( p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        return( ret );
    }

    if( *p + len != end )
        return( MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    while( *p < end )
    {
        unsigned char const tag = *(*p)++;

        if( ( tag & tag_must_mask ) != tag_must_val )
            return( MBEDTLS_ERR_ASN1_UNEXPECTED_TAG );

        if( ( ret = mbedtls_asn1_get_len( p, end, &len ) ) != 0 )
            return( ret );

        if( ( tag & tag_may_mask ) == tag_may_val )
        {
            if( cb != NULL )
            {
                ret = cb( ctx, tag, *p, len );
                if( ret != 0 )
                    return( ret );
            }
        }

        *p += len;
    }

    return( 0 );
}